

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.cpp
# Opt level: O2

Reals __thiscall
Omega_h::measure_ents_real(Omega_h *this,Mesh *mesh,Int ent_dim,LOs *a2e,Reals *coords)

{
  Int IVar1;
  void *extraout_RDX;
  Write<double> *this_00;
  Write<int> *this_01;
  Reals RVar2;
  Write<int> local_f0;
  Write<int> local_e0;
  Write<int> local_d0;
  Write<int> local_c0;
  Write<int> local_b0;
  Write<int> local_a0;
  Write<double> local_90;
  Write<double> local_80;
  Write<double> local_70;
  Write<double> local_60;
  Write<double> local_50;
  Write<double> local_40;
  
  IVar1 = Mesh::dim(mesh);
  if (ent_dim == 3 && IVar1 == 3) {
    Write<int>::Write(&local_a0,&a2e->write_);
    this_00 = &local_40;
    Write<double>::Write(this_00,&coords->write_);
    this_01 = &local_a0;
    measure_ents_real_tmpl<3,3>(this,mesh,(LOs *)this_01,(Reals *)this_00);
  }
  else {
    IVar1 = Mesh::dim(mesh);
    if (IVar1 == 3 && (ent_dim ^ 2U) == 0) {
      Write<int>::Write(&local_b0,&a2e->write_);
      this_00 = &local_50;
      Write<double>::Write(this_00,&coords->write_);
      this_01 = &local_b0;
      measure_ents_real_tmpl<3,2>(this,mesh,(LOs *)this_01,(Reals *)this_00);
    }
    else {
      IVar1 = Mesh::dim(mesh);
      if (IVar1 == 3 && (ent_dim ^ 1U) == 0) {
        Write<int>::Write(&local_c0,&a2e->write_);
        this_00 = &local_60;
        Write<double>::Write(this_00,&coords->write_);
        this_01 = &local_c0;
        measure_ents_real_tmpl<3,1>(this,mesh,(LOs *)this_01,(Reals *)this_00);
      }
      else {
        IVar1 = Mesh::dim(mesh);
        if ((ent_dim ^ 2U) == 0 && IVar1 == 2) {
          Write<int>::Write(&local_d0,&a2e->write_);
          this_00 = &local_70;
          Write<double>::Write(this_00,&coords->write_);
          this_01 = &local_d0;
          measure_ents_real_tmpl<2,2>(this,mesh,(LOs *)this_01,(Reals *)this_00);
        }
        else {
          IVar1 = Mesh::dim(mesh);
          if ((ent_dim ^ 1U) == 0 && IVar1 == 2) {
            Write<int>::Write(&local_e0,&a2e->write_);
            this_00 = &local_80;
            Write<double>::Write(this_00,&coords->write_);
            this_01 = &local_e0;
            measure_ents_real_tmpl<2,1>(this,mesh,(LOs *)this_01,(Reals *)this_00);
          }
          else {
            IVar1 = Mesh::dim(mesh);
            if ((ent_dim != 1) || (IVar1 != 1)) {
              fail("assertion %s failed at %s +%d\n","false",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_shape.cpp"
                   ,0x50);
            }
            Write<int>::Write(&local_f0,&a2e->write_);
            this_00 = &local_90;
            Write<double>::Write(this_00,&coords->write_);
            this_01 = &local_f0;
            measure_ents_real_tmpl<1,1>(this,mesh,(LOs *)this_01,(Reals *)this_00);
          }
        }
      }
    }
  }
  Write<double>::~Write(this_00);
  Write<int>::~Write(this_01);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals measure_ents_real(Mesh* mesh, Int ent_dim, LOs a2e, Reals coords) {
  if (mesh->dim() == 3 && ent_dim == 3)
    return measure_ents_real_tmpl<3, 3>(mesh, a2e, coords);
  if (mesh->dim() == 3 && ent_dim == 2)
    return measure_ents_real_tmpl<3, 2>(mesh, a2e, coords);
  if (mesh->dim() == 3 && ent_dim == 1)
    return measure_ents_real_tmpl<3, 1>(mesh, a2e, coords);
  if (mesh->dim() == 2 && ent_dim == 2)
    return measure_ents_real_tmpl<2, 2>(mesh, a2e, coords);
  if (mesh->dim() == 2 && ent_dim == 1)
    return measure_ents_real_tmpl<2, 1>(mesh, a2e, coords);
  if (mesh->dim() == 1 && ent_dim == 1)
    return measure_ents_real_tmpl<1, 1>(mesh, a2e, coords);
  OMEGA_H_NORETURN(Reals());
}